

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void ComputeMulticastHash(uchar *MulticastMAC,uint8_t *regAddr,uint16_t *regData)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  size_t j;
  long lVar6;
  
  uVar5 = 0xffffffff;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      iVar2 = (int)uVar5 >> 0x1f;
      uVar3 = uVar5 * 2;
      uVar5 = uVar3 ^ 0x4c11db7;
      if (-iVar2 == (uint)((MulticastMAC[lVar4] >> ((uint)lVar6 & 0x1f) & 1) != 0)) {
        uVar5 = uVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  bVar1 = (byte)(uVar5 >> 0x18);
  *regAddr = bVar1 >> 5 & 6 | 0xa0;
  *regData = (uint16_t)(1 << (bVar1 >> 2 & 0xf));
  return;
}

Assistant:

void ComputeMulticastHash(unsigned char *MulticastMAC, uint8_t &regAddr, uint16_t &regData)
{
    uint32_t crc = KSZ8851CRC(MulticastMAC, 6);
    int regOffset = (crc >> 29) & 0x0006;  // first 2 bits of CRC (x2)
    int regBit = (crc >> 26) & 0x00F;      // next 4 bits of CRC
    regAddr = 0xA0 + regOffset;            // 0xA0 --> MAHTR0 (MAC Address Hash Table Register 0)
    regData = (1 << regBit);
}